

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O2

void TTD::NSSnapValues::EmitPromiseReactionInfo
               (SnapPromiseReactionInfo *reactionInfo,FileWriter *writer,Separator separator)

{
  undefined7 in_register_00000011;
  
  (*writer->_vptr_FileWriter[6])(writer,CONCAT71(in_register_00000011,separator) & 0xffffffff);
  FileWriter::WriteAddr(writer,ptrIdVal,reactionInfo->PromiseReactionId,NoSeparator);
  FileWriter::WriteAddr(writer,ptrIdVal,reactionInfo->HandlerObjId,CommaSeparator);
  (*writer->_vptr_FileWriter[3])(writer,3,1);
  EmitPromiseCapabilityInfo(&reactionInfo->Capabilities,writer,NoSeparator);
  (*writer->_vptr_FileWriter[7])(writer,0);
  return;
}

Assistant:

void EmitPromiseReactionInfo(const SnapPromiseReactionInfo* reactionInfo, FileWriter* writer, NSTokens::Separator separator)
        {
            writer->WriteRecordStart(separator);

            writer->WriteAddr(NSTokens::Key::ptrIdVal, reactionInfo->PromiseReactionId);

            writer->WriteAddr(NSTokens::Key::ptrIdVal, reactionInfo->HandlerObjId, NSTokens::Separator::CommaSeparator);
            writer->WriteKey(NSTokens::Key::entry, NSTokens::Separator::CommaSeparator);
            EmitPromiseCapabilityInfo(&reactionInfo->Capabilities, writer, NSTokens::Separator::NoSeparator);

            writer->WriteRecordEnd();
        }